

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * GetFileExtension(string *__return_storage_ptr__,string *fileName)

{
  long lVar1;
  allocator local_19;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)fileName,0x107175);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  else {
    std::__cxx11::string::find_last_of((char *)fileName,0x107175);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)fileName);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetFileExtension(const string& fileName)
{
    if(fileName.find_last_of(".") != std::string::npos)
        return fileName.substr(fileName.find_last_of(".")+1);
    return "";
}